

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O2

void funnelsort_Kway<64u,buffer_layout_bfs>(uchar **strings,size_t n)

{
  size_t n_00;
  unsigned_long uVar1;
  unsigned_long uVar2;
  int iVar3;
  uchar **tmp;
  ostream *poVar4;
  size_t depth;
  uchar **ppuVar5;
  long lVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  fill<64U,_2U,_buffer_layout_bfs> local_a4b9;
  DI __d;
  array<unsigned_long,_64UL> buffer_count;
  array<Stream,_64UL> streams;
  array<unsigned_char_*,_5068UL> buffers;
  
  tmp = (uchar **)malloc(n * 8);
  poVar4 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"funnelsort");
  poVar4 = std::operator<<(poVar4,"(), n=");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::operator<<(poVar4,"\n");
  if (n < 0x20) {
    insertion_sort(strings,(int)n,depth);
  }
  else {
    streams._M_elems[0].n = n >> 6;
    streams._M_elems[0].stream = strings;
    ppuVar5 = strings + streams._M_elems[0].n;
    for (lVar6 = 0x18; lVar6 != 0x3f8; lVar6 = lVar6 + 0x10) {
      *(uchar ***)((long)streams._M_elems + lVar6 + -8) = ppuVar5;
      *(size_t *)((long)&streams._M_elems[0].stream + lVar6) = streams._M_elems[0].n;
      ppuVar5 = ppuVar5 + streams._M_elems[0].n;
    }
    streams._M_elems[0x3f].stream = streams._M_elems[0x3e].stream + streams._M_elems[0].n;
    streams._M_elems[0x3f].n = streams._M_elems[0].n * -0x3f + n;
    for (lVar6 = 0; lVar6 != 0x400; lVar6 = lVar6 + 0x10) {
      ppuVar5 = *(uchar ***)((long)&streams._M_elems[0].stream + lVar6);
      n_00 = *(size_t *)((long)&streams._M_elems[0].n + lVar6);
      funnelsort<16u,buffer_layout_bfs>(ppuVar5,n_00,tmp);
      check_input(ppuVar5,n_00);
    }
    buffers._M_elems[0] = (uchar *)0x0;
    std::array<unsigned_long,_64UL>::fill(&buffer_count,(value_type_conflict *)&buffers);
    poVar4 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,"fill_root");
    std::operator<<(poVar4,", root\n");
    __d.i = &__debug_indent_str_abi_cxx11_;
    std::__cxx11::string::append((char *)&__debug_indent_str_abi_cxx11_);
    ppuVar5 = tmp;
    while( true ) {
      if ((buffer_count._M_elems[2] == 0) &&
         (fill<64U,_2U,_buffer_layout_bfs>::operator()
                    (&local_a4b9,&streams,buffers._M_elems,&buffer_count),
         buffer_count._M_elems[2] == 0)) {
        poVar4 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar4,"left stream drained\n");
        if (buffer_count._M_elems[2] != 0) {
          __assert_fail("buffer_count[2] == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                        ,0x238,
                        "void fill_root(std::array<Stream, K> &__restrict, unsigned char **__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict) [K = 64U, BufferLayout = buffer_layout_bfs]"
                       );
        }
        if (buffer_count._M_elems[3] == 0) {
          __assert_fail("buffer_count[3] != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                        ,0x239,
                        "void fill_root(std::array<Stream, K> &__restrict, unsigned char **__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict) [K = 64U, BufferLayout = buffer_layout_bfs]"
                       );
        }
        while (uVar1 = buffer_count._M_elems[3], buffer_count._M_elems[3] != 0) {
          if (buffer_count._M_elems[3] * 8 != 0) {
            memcpy(ppuVar5,(void *)((long)&buffers + buffer_count._M_elems[3] * -8 + 0x80),
                   buffer_count._M_elems[3] * 8);
          }
          buffer_count._M_elems[3] = 0;
          fill<64U,_3U,_buffer_layout_bfs>::operator()
                    ((fill<64U,_3U,_buffer_layout_bfs> *)&local_a4b9,&streams,buffers._M_elems,
                     &buffer_count);
          ppuVar5 = ppuVar5 + uVar1;
        }
        goto LAB_0012cb8a;
      }
      if ((buffer_count._M_elems[3] == 0) &&
         (fill<64U,_3U,_buffer_layout_bfs>::operator()
                    ((fill<64U,_3U,_buffer_layout_bfs> *)&local_a4b9,&streams,buffers._M_elems,
                     &buffer_count), buffer_count._M_elems[3] == 0)) break;
      uVar2 = buffer_count._M_elems[3];
      uVar1 = buffer_count._M_elems[2];
      poVar4 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
      poVar4 = std::operator<<(poVar4,"L:\'");
      puVar8 = (undefined8 *)((long)&buffers + (8 - uVar1) * 8);
      poVar4 = std::operator<<(poVar4,(char *)*puVar8);
      poVar4 = std::operator<<(poVar4,"\', R:\'");
      puVar7 = (undefined8 *)((long)&buffers + (8 - uVar2) * 8 + 0x40);
      poVar4 = std::operator<<(poVar4,(char *)*puVar7);
      std::operator<<(poVar4,"\'\n");
      iVar3 = cmp((void *)*puVar8,(void *)*puVar7);
      if (iVar3 < 1) {
        puVar7 = puVar8;
      }
      buffer_count._M_elems[(ulong)(0 < iVar3) + 2] =
           buffer_count._M_elems[(ulong)(0 < iVar3) + 2] - 1;
      *ppuVar5 = (uchar *)*puVar7;
      ppuVar5 = ppuVar5 + 1;
    }
    poVar4 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
    std::operator<<(poVar4,"right stream drained\n");
    if (buffer_count._M_elems[2] == 0) {
      __assert_fail("buffer_count[2] != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                    ,0x247,
                    "void fill_root(std::array<Stream, K> &__restrict, unsigned char **__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict) [K = 64U, BufferLayout = buffer_layout_bfs]"
                   );
    }
    if (buffer_count._M_elems[3] != 0) {
      __assert_fail("buffer_count[3] == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                    ,0x248,
                    "void fill_root(std::array<Stream, K> &__restrict, unsigned char **__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict) [K = 64U, BufferLayout = buffer_layout_bfs]"
                   );
    }
    while (uVar1 = buffer_count._M_elems[2], buffer_count._M_elems[2] != 0) {
      memcpy(ppuVar5,(void *)((long)&buffers + buffer_count._M_elems[2] * -8 + 0x40),
             buffer_count._M_elems[2] * 8);
      buffer_count._M_elems[2] = 0;
      fill<64U,_2U,_buffer_layout_bfs>::operator()
                (&local_a4b9,&streams,buffers._M_elems,&buffer_count);
      ppuVar5 = ppuVar5 + uVar1;
    }
LAB_0012cb8a:
    anon_func::DI::~DI(&__d);
    memcpy(strings,tmp,n * 8);
    check_input(strings,n);
  }
  free(tmp);
  return;
}

Assistant:

void funnelsort_Kway(unsigned char** strings, size_t n)
{
	unsigned char** tmp = static_cast<unsigned char**>(
			malloc(n*sizeof(unsigned char*)));
	funnelsort<K, BufferLayout>(strings, n, tmp);
	free(tmp);
}